

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevcd_bitstream.c
# Opt level: O0

UWORD32 ihevcd_bits_num_bits_remaining(bitstrm_t *ps_bitstrm)

{
  uint uVar1;
  uint uVar2;
  UWORD32 u4_size_in_bits;
  UWORD32 u4_bits_consumed;
  bitstrm_t *ps_bitstrm_local;
  UWORD32 local_4;
  
  uVar1 = (((int)ps_bitstrm->pu4_buf - (int)ps_bitstrm->pu1_buf_base) + -8) * 8 +
          ps_bitstrm->u4_bit_ofst;
  uVar2 = (((int)ps_bitstrm->pu1_buf_max - (int)ps_bitstrm->pu1_buf_base) + -8) * 8;
  if (uVar1 < uVar2) {
    local_4 = uVar2 - uVar1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

UWORD32  ihevcd_bits_num_bits_remaining(bitstrm_t *ps_bitstrm)
{
    UWORD32 u4_bits_consumed;
    UWORD32 u4_size_in_bits;

    /* 8 bytes are read in cur_word and nxt_word at the start. Hence */
    /* subtract 8 bytes */
    u4_bits_consumed = (UWORD32)(((UWORD8 *)ps_bitstrm->pu4_buf -
                                  (UWORD8 *)ps_bitstrm->pu1_buf_base - 8) <<
                                 3) + ps_bitstrm->u4_bit_ofst;

    u4_size_in_bits = (UWORD32)(ps_bitstrm->pu1_buf_max -
                    ps_bitstrm->pu1_buf_base) - 8;
    u4_size_in_bits <<= 3;
    if(u4_size_in_bits > u4_bits_consumed)
    {
        return (u4_size_in_bits - u4_bits_consumed);
    }
    else
    {
        return 0;
    }
}